

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrLevel.cpp
# Opt level: O0

void __thiscall
amrex::AmrLevel::UpdateDistributionMaps(AmrLevel *this,DistributionMapping *update_dmap)

{
  Long LVar1;
  Long LVar2;
  StateData *this_00;
  StateData *this_01;
  int i;
  Long mapsize;
  DistributionMapping *in_stack_ffffffffffffffc8;
  DistributionMapping *in_stack_ffffffffffffffd0;
  undefined4 local_1c;
  
  LVar1 = DistributionMapping::size((DistributionMapping *)0x11010c2);
  LVar2 = DistributionMapping::size((DistributionMapping *)0x11010d8);
  if (LVar2 == LVar1) {
    DistributionMapping::operator=(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  local_1c = 0;
  while( true ) {
    this_00 = (StateData *)(long)local_1c;
    LVar2 = Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::size
                      ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)0x1101118);
    if (LVar2 <= (long)this_00) break;
    this_01 = Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
                        ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)this_00,
                         (size_type)in_stack_ffffffffffffffc8);
    StateData::DistributionMap(this_01);
    LVar2 = DistributionMapping::size((DistributionMapping *)0x110114b);
    if (LVar2 == LVar1) {
      Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
                ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)this_00,
                 (size_type)in_stack_ffffffffffffffc8);
      StateData::setDistributionMap(this_00,in_stack_ffffffffffffffc8);
    }
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void
AmrLevel::UpdateDistributionMaps ( DistributionMapping& update_dmap )
{
    Long mapsize = update_dmap.size();

    if (dmap.size() == mapsize)
    { dmap = update_dmap; }

    for (int i = 0; i < state.size(); ++i)
    {
       if (state[i].DistributionMap().size() == mapsize)
          { state[i].setDistributionMap(update_dmap); }
    }
}